

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_proj.c
# Opt level: O0

int CVodeGetNumProjFails(void *cvode_mem,long *npfails)

{
  undefined8 *in_RSI;
  CVodeProjMem proj_mem;
  CVodeMem cv_mem;
  int retval;
  CVodeMem *in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  void *in_stack_ffffffffffffffd8;
  int local_4;
  
  local_4 = cvAccessProjMem(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                            in_stack_ffffffffffffffc8,(CVodeProjMem *)0x144289);
  if (local_4 == 0) {
    *in_RSI = *(undefined8 *)(in_stack_ffffffffffffffd0 + 0x48);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int CVodeGetNumProjFails(void* cvode_mem, long int* npfails)
{
  int retval;
  CVodeMem cv_mem;
  CVodeProjMem proj_mem;

  /* Access memory structures */
  retval = cvAccessProjMem(cvode_mem, __func__, &cv_mem, &proj_mem);
  if (retval != CV_SUCCESS) { return (retval); }

  /* Get number of projection fails */
  *npfails = proj_mem->npfails;

  return (CV_SUCCESS);
}